

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O2

DdNode * GetSingleOutputFunction
                   (DdManager *dd,DdNode **pbOuts,int nOuts,DdNode **pbVarsEnc,int nVarsEnc,
                   int fVerbose)

{
  int iVar1;
  uint uVar2;
  DdNode *pDVar3;
  DdNode *n;
  ulong uVar4;
  int *piVar5;
  DdNode *n_00;
  ulong uVar6;
  int Order [1024];
  
  uVar6 = 0;
  uVar4 = 0;
  if (0 < nOuts) {
    uVar4 = (ulong)(uint)nOuts;
  }
  piVar5 = s_SuppSize;
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    iVar1 = Cudd_SupportSize(dd,pbOuts[uVar6]);
    *piVar5 = iVar1;
    Order[uVar6] = (int)uVar6;
    piVar5 = piVar5 + 1;
  }
  qsort(Order,(long)nOuts,4,CompareSupports);
  n_00 = (DdNode *)((ulong)dd->one ^ 1);
  Cudd_Ref(n_00);
  for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    pDVar3 = Extra_bddBitsToCube(dd,(int)uVar6,nVarsEnc,pbVarsEnc,1);
    Cudd_Ref(pDVar3);
    n = Cudd_bddAnd(dd,pDVar3,pbOuts[Order[uVar6]]);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,pDVar3);
    pDVar3 = Cudd_bddOr(dd,n,n_00);
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,n_00);
    Cudd_RecursiveDeref(dd,n);
    n_00 = pDVar3;
  }
  if (fVerbose != 0) {
    uVar2 = Cudd_DagSize(n_00);
    printf("Single BDD size = %6d nodes\n",(ulong)uVar2);
  }
  pDVar3 = Cudd_BddToAdd(dd,n_00);
  Cudd_Ref(pDVar3);
  Cudd_RecursiveDeref(dd,n_00);
  if (fVerbose != 0) {
    uVar2 = Cudd_DagSize(pDVar3);
    printf("MTBDD           = %6d nodes\n",(ulong)uVar2);
  }
  Cudd_Deref(pDVar3);
  return pDVar3;
}

Assistant:

DdNode * GetSingleOutputFunction( DdManager * dd, DdNode ** pbOuts, int nOuts, DdNode ** pbVarsEnc, int nVarsEnc, int fVerbose )
{
    int i;
    DdNode * bResult, * aResult;
    DdNode * bCube, * bTemp, * bProd;

    int Order[MAXOUTPUTS];
//  int OrderMint[MAXOUTPUTS];
 
    // sort the output according to their support size
    for ( i = 0; i < nOuts; i++ )
    {
        s_SuppSize[i] = Cudd_SupportSize( dd, pbOuts[i] );
//      s_MintOnes[i] = BitCount8[i];
        Order[i]      = i;
//      OrderMint[i]  = i;
    }
    
    // order the outputs
    qsort( (void*)Order,     (size_t)nOuts, sizeof(int), (int(*)(const void*, const void*)) CompareSupports );
    // order the outputs
//  qsort( (void*)OrderMint, (size_t)nOuts, sizeof(int), (int(*)(const void*, const void*)) CompareMinterms );


    bResult = b0;   Cudd_Ref( bResult );
    for ( i = 0; i < nOuts; i++ )
    {
//      bCube   = Cudd_bddBitsToCube( dd, OrderMint[i], nVarsEnc, pbVarsEnc );   Cudd_Ref( bCube );
//      bProd   = Cudd_bddAnd( dd, bCube, pbOuts[Order[nOuts-1-i]] );         Cudd_Ref( bProd );
        bCube   = Extra_bddBitsToCube( dd, i, nVarsEnc, pbVarsEnc, 1 );   Cudd_Ref( bCube );
        bProd   = Cudd_bddAnd( dd, bCube, pbOuts[Order[i]] );         Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bCube );

        bResult = Cudd_bddOr( dd, bProd, bTemp = bResult );           Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
    }

    // convert to the ADD
if ( fVerbose )
printf( "Single BDD size = %6d nodes\n", Cudd_DagSize(bResult) );
    aResult = Cudd_BddToAdd( dd, bResult );  Cudd_Ref( aResult );
    Cudd_RecursiveDeref( dd, bResult );
if ( fVerbose )
printf( "MTBDD           = %6d nodes\n", Cudd_DagSize(aResult) );
    Cudd_Deref( aResult );
    return aResult;
}